

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STGV.cpp
# Opt level: O0

void __thiscall STGV::STGV(STGV *this,ASTNode *root)

{
  SymbolTable *this_00;
  Detector *this_01;
  ASTNode *pAVar1;
  ASTNode *root_local;
  STGV *this_local;
  
  Visitor::Visitor(&this->super_Visitor);
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR_visit_001a35e8;
  std::__cxx11::string::string((string *)&this->currentFuncName);
  std::__cxx11::string::string((string *)&this->currentNamespace);
  this_00 = (SymbolTable *)operator_new(0x78);
  (this_00->freeFunctions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->freeFunctions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->freeFunctions)._M_h._M_element_count = 0;
  *(undefined8 *)&(this_00->freeFunctions)._M_h._M_rehash_policy = 0;
  (this_00->freeFunctions)._M_h._M_bucket_count = 0;
  (this_00->freeFunctions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->classes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->freeFunctions)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined8 *)&(this_00->classes)._M_h._M_rehash_policy = 0;
  (this_00->classes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->classes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->classes)._M_h._M_element_count = 0;
  (this_00->classes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this_00->classes)._M_h._M_bucket_count = 0;
  this_00->main = (Function *)0x0;
  Semantic::SymbolTable::SymbolTable(this_00);
  this->symbolTable = this_00;
  this_01 = (Detector *)operator_new(0x48);
  Semantic::Detector::Detector(this_01,this->symbolTable);
  this->detector = this_01;
  pAVar1 = AST::ASTNode::getChild(root,0);
  (**pAVar1->_vptr_ASTNode)(pAVar1,this);
  return;
}

Assistant:

STGV::STGV(AST::ASTNode *root) {
    this->symbolTable = new Semantic::SymbolTable();
    this->detector = new Semantic::Detector(this->symbolTable);
    root->getChild(0)->accept(*this);
}